

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::~Logger(Logger *this)

{
  int len;
  LogStream *pLVar1;
  Buffer *this_00;
  char *msg;
  Buffer *buf;
  Logger *this_local;
  
  pLVar1 = LogStream::operator<<((LogStream *)this," -- ");
  pLVar1 = LogStream::operator<<(pLVar1,&(this->impl_).basename_);
  pLVar1 = LogStream::operator<<(pLVar1,":");
  pLVar1 = LogStream::operator<<(pLVar1,(this->impl_).line_);
  LogStream::operator<<(pLVar1,"\n");
  pLVar1 = stream(this);
  this_00 = LogStream::buffer(pLVar1);
  msg = FixedBuffer<4000>::data(this_00);
  len = FixedBuffer<4000>::length(this_00);
  output(msg,len);
  Impl::~Impl(&this->impl_);
  return;
}

Assistant:

Logger::~Logger() {
    impl_.stream_ << " -- " << impl_.basename_ << ":" << impl_.line_ << "\n";
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}